

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O2

void setIndex2Entry(UNewTrie2 *trie,int32_t i2,int32_t block)

{
  int32_t *piVar1;
  int iVar2;
  int iVar3;
  
  trie->map[(uint)block >> 5] = trie->map[(uint)block >> 5] + 1;
  iVar2 = trie->index2[(uint)i2];
  iVar3 = iVar2 >> 5;
  piVar1 = trie->map + iVar3;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    trie->map[iVar3] = -trie->firstFreeBlock;
    trie->firstFreeBlock = iVar2;
  }
  trie->index2[(uint)i2] = block;
  return;
}

Assistant:

static inline void
setIndex2Entry(UNewTrie2 *trie, int32_t i2, int32_t block) {
    int32_t oldBlock;
    ++trie->map[block>>UTRIE2_SHIFT_2];  /* increment first, in case block==oldBlock! */
    oldBlock=trie->index2[i2];
    if(0 == --trie->map[oldBlock>>UTRIE2_SHIFT_2]) {
        releaseDataBlock(trie, oldBlock);
    }
    trie->index2[i2]=block;
}